

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O3

bool __thiscall
rapidjson::
Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
::Double(Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
         *this,double d)

{
  Stack<rapidjson::CrtAllocator> *this_00;
  GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *pGVar1;
  char *pcVar2;
  char *pcVar3;
  char *buffer;
  
  Prefix(this,kNumberType);
  this_00 = &this->os_->stack_;
  buffer = this_00->stackTop_;
  if (this_00->stackEnd_ <= buffer + 0x19) {
    internal::Stack<rapidjson::CrtAllocator>::Expand<char>(this_00,0x19);
    buffer = this_00->stackTop_;
  }
  this_00->stackTop_ = buffer + 0x19;
  pcVar3 = internal::dtoa(d,buffer);
  pGVar1 = this->os_;
  pcVar2 = (pGVar1->stack_).stackTop_;
  if (((long)buffer - (long)pcVar3) + 0x19U <= (ulong)((long)pcVar2 - (long)(pGVar1->stack_).stack_)
     ) {
    (pGVar1->stack_).stackTop_ = pcVar2 + (-0x19 - ((long)buffer - (long)pcVar3));
    return true;
  }
  __assert_fail("GetSize() >= count * sizeof(T)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ntrrgc[P]pulse-volume-monitor/vendor/rapidjson/internal/stack.h"
                ,0x71,
                "T *rapidjson::internal::Stack<rapidjson::CrtAllocator>::Pop(size_t) [Allocator = rapidjson::CrtAllocator, T = char]"
               );
}

Assistant:

bool Double(double d)       { Prefix(kNumberType); return WriteDouble(d); }